

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O1

void __thiscall CVmHashTable::move_entries_to(CVmHashTable *this,CVmHashTable *new_tab)

{
  CVmHashEntry *pCVar1;
  CVmHashEntry *pCVar2;
  uint uVar3;
  ulong uVar4;
  CVmHashEntry **ppCVar5;
  
  if (this->table_size_ != 0) {
    ppCVar5 = this->table_;
    uVar4 = 0;
    do {
      pCVar2 = *ppCVar5;
      while (pCVar2 != (CVmHashEntry *)0x0) {
        pCVar1 = pCVar2->nxt_;
        pCVar2->nxt_ = (CVmHashEntry *)0x0;
        uVar3 = (*new_tab->hash_function_->_vptr_CVmHashFunc[2])
                          (new_tab->hash_function_,pCVar2->str_,pCVar2->len_);
        uVar3 = (int)new_tab->table_size_ - 1U & uVar3;
        pCVar2->nxt_ = new_tab->table_[uVar3];
        new_tab->table_[uVar3] = pCVar2;
        pCVar2 = pCVar1;
      }
      *ppCVar5 = (CVmHashEntry *)0x0;
      uVar4 = uVar4 + 1;
      ppCVar5 = ppCVar5 + 1;
    } while (uVar4 < this->table_size_);
  }
  return;
}

Assistant:

void CVmHashTable::move_entries_to(CVmHashTable *new_tab)
{
    CVmHashEntry **tableptr;
    size_t i;

    /* go through each hash value */
    for (tableptr = table_, i = 0 ; i < table_size_ ; ++i, ++tableptr)
    {
        CVmHashEntry *entry;
        CVmHashEntry *nxt;

        /* go through each entry at this hash value */
        for (entry = *tableptr ; entry ; entry = nxt)
        {
            /* 
             *   remember the next entry, since we'll be unlinking it from
             *   this table, which will render the nxt_ member unusable
             *   for the purposes of completing this enumeration 
             */
            nxt = entry->nxt_;

            /* 
             *   clear the 'next' pointer in this entry, to unlink it from
             *   our table - since everything is being removed, there's no
             *   need to worry about what came before us 
             */
            entry->nxt_ = 0;

            /* add the entry to the new hash table */
            new_tab->add(entry);
        }

        /* 
         *   clear this hash value chain head - we've now removed
         *   everything from it 
         */
        *tableptr = 0;
    }
}